

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O1

void test_64_67(QPDF *pdf,char *arg2,bool allow_shrink,bool allow_expand)

{
  Rectangle RVar1;
  long lVar2;
  ulong uVar3;
  undefined7 in_register_00000009;
  undefined7 in_register_00000011;
  ulong uVar4;
  long lVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  QPDFObjectHandle QVar7;
  QPDFObjectHandle QVar8;
  QPDFObjectHandle QVar9;
  QPDFObjectHandle QVar10;
  QPDFObjectHandle QVar11;
  QPDFWriter w;
  string content;
  QPDF pdf2;
  int min_suffix;
  QPDFObjectHandle resources;
  QPDFObjectHandle fo;
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> pages2;
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> pages1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  undefined1 local_178 [16];
  element_type *local_168 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  QPDF local_130 [12];
  undefined4 local_124;
  undefined4 local_120;
  undefined4 local_11c;
  long *local_118;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_110;
  long local_108 [2];
  string local_f8 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_f0;
  undefined8 local_e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_e0;
  undefined8 local_d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_d0;
  long local_c8;
  long local_c0;
  long local_b0;
  long local_a8;
  ulong local_98;
  undefined1 local_90 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_88;
  undefined1 local_80 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_78;
  undefined1 local_70 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  undefined1 local_60 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  double dStack_38;
  
  local_120 = (undefined4)CONCAT71(in_register_00000009,allow_expand);
  local_124 = (undefined4)CONCAT71(in_register_00000011,allow_shrink);
  local_158._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pdf;
  if (arg2 == (char *)0x0) {
LAB_00143306:
    __assert_fail("arg2",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0x91c,"void test_64_67(QPDF &, const char *, bool, bool)");
  }
  QPDF::QPDF(local_130);
  QPDF::processFile((char *)local_130,arg2);
  QPDFPageDocumentHelper::QPDFPageDocumentHelper
            ((QPDFPageDocumentHelper *)local_178,(QPDF *)local_158._M_pi);
  QPDFPageDocumentHelper::getAllPages();
  QPDFPageDocumentHelper::~QPDFPageDocumentHelper((QPDFPageDocumentHelper *)local_178);
  QPDFPageDocumentHelper::QPDFPageDocumentHelper((QPDFPageDocumentHelper *)local_178,local_130);
  QPDFPageDocumentHelper::getAllPages();
  QPDFPageDocumentHelper::~QPDFPageDocumentHelper((QPDFPageDocumentHelper *)local_178);
  uVar3 = (local_a8 - local_b0 >> 3) * 0x6db6db6db6db6db7;
  local_98 = (local_c0 - local_c8 >> 3) * 0x6db6db6db6db6db7;
  if (uVar3 < local_98) {
    local_98 = uVar3;
  }
  if (local_98 != 0) {
    lVar5 = 0;
    uVar3 = 0;
    do {
      lVar2 = local_b0;
      uVar4 = (local_a8 - local_b0 >> 3) * 0x6db6db6db6db6db7;
      if (uVar4 < uVar3 || uVar4 - uVar3 == 0) {
LAB_001432f5:
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar3
                  );
        goto LAB_00143306;
      }
      uVar4 = (local_c0 - local_c8 >> 3) * 0x6db6db6db6db6db7;
      if (uVar4 < uVar3 || uVar4 - uVar3 == 0) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar3
                  );
        goto LAB_001432f5;
      }
      QPDFPageObjectHelper::getFormXObjectForPage(SUB81(local_90,0));
      QVar7.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = local_158._M_pi;
      QVar7.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)&local_e8;
      QPDF::copyForeignObject(QVar7);
      if (local_88 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88);
      }
      local_11c = 1;
      local_178._0_8_ = local_168;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"/Resources","");
      _Var6._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(lVar2 + lVar5);
      QPDFPageObjectHelper::getAttribute(local_f8,SUB81(_Var6._M_pi,0));
      if ((element_type **)local_178._0_8_ != local_168) {
        operator_delete((void *)local_178._0_8_,(ulong)(local_168[0] + 1));
      }
      local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"/Fx","");
      QPDFObjectHandle::getUniqueResourceName((string *)local_178,(int *)local_f8,(set *)&local_150)
      ;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p != &local_150.field_2) {
        operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
      }
      local_d8 = local_e8;
      local_d0 = local_e0;
      if (local_e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_e0->_M_use_count = local_e0->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_e0->_M_use_count = local_e0->_M_use_count + 1;
        }
      }
      QPDFPageObjectHelper::getTrimBox(SUB81(&local_198,0),SUB81(_Var6._M_pi,0));
      QPDFObjectHandle::getArrayAsRectangle();
      RVar1.lly = (double)uStack_48;
      RVar1.llx = (double)local_50;
      RVar1.urx = (double)local_40;
      RVar1.ury = dStack_38;
      QVar8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = _Var6._M_pi;
      QVar8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)&local_150;
      QPDFPageObjectHelper::placeFormXObject
                (QVar8,(string *)&local_d8,RVar1,SUB81((string *)local_178,0),false,local_124._0_1_)
      ;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._M_string_length);
      }
      if (local_d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d0);
      }
      if (local_150._M_string_length != 0) {
        local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_198,"<< /XObject << >> >>","");
        local_118 = local_108;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"");
        QPDFObjectHandle::parse((string *)local_60,(string *)&local_198);
        QVar9.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60;
        QVar9.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             = (element_type *)local_f8;
        QPDFObjectHandle::mergeResources(QVar9,(map *)0x0);
        if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
        }
        if (local_118 != local_108) {
          operator_delete(local_118,local_108[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198._M_dataplus._M_p != &local_198.field_2) {
          operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
        }
        local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"/XObject","");
        QPDFObjectHandle::getKey((string *)&local_118);
        QPDFObjectHandle::replaceKey((string *)&local_118,(QPDFObjectHandle *)local_178);
        if (local_110 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_110);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198._M_dataplus._M_p != &local_198.field_2) {
          operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
        }
        local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"q\n","");
        QPDFObjectHandle::newStream((QPDF *)local_70,(string *)local_158._M_pi);
        QVar10.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70;
        QVar10.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)_Var6._M_pi;
        QPDFPageObjectHelper::addPageContents(QVar10,true);
        if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198._M_dataplus._M_p != &local_198.field_2) {
          operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
        }
        std::operator+(&local_198,"\nQ\n",&local_150);
        QPDFObjectHandle::newStream((QPDF *)local_80,(string *)local_158._M_pi);
        QVar11.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80;
        QVar11.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)_Var6._M_pi;
        QPDFPageObjectHelper::addPageContents(QVar11,false);
        if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198._M_dataplus._M_p != &local_198.field_2) {
          operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p != &local_150.field_2) {
        operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
      }
      if ((element_type **)local_178._0_8_ != local_168) {
        operator_delete((void *)local_178._0_8_,(ulong)(local_168[0] + 1));
      }
      if (local_f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f0);
      }
      if (local_e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e0);
      }
      uVar3 = uVar3 + 1;
      lVar5 = lVar5 + 0x38;
    } while (local_98 != uVar3);
  }
  QPDFWriter::QPDFWriter((QPDFWriter *)local_178,(QPDF *)local_158._M_pi,"a.pdf");
  QPDFWriter::setQDFMode(SUB81(local_178,0));
  QPDFWriter::setStaticID(SUB81(local_178,0));
  QPDFWriter::write();
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_178._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_178._8_8_);
  }
  std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector
            ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)&local_c8);
  std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector
            ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)&local_b0);
  QPDF::~QPDF(local_130);
  return;
}

Assistant:

static void
test_64_67(QPDF& pdf, char const* arg2, bool allow_shrink, bool allow_expand)
{
    // Overlay file2 on file1.
    // 64: allow neither shrink nor shrink
    // 65: allow shrink but not expand
    // 66: allow expand but not shrink
    // 67: allow both shrink and expand

    // Placing form XObjects: expand, shrink
    assert(arg2);
    QPDF pdf2;
    pdf2.processFile(arg2);

    std::vector<QPDFPageObjectHelper> pages1 = QPDFPageDocumentHelper(pdf).getAllPages();
    std::vector<QPDFPageObjectHelper> pages2 = QPDFPageDocumentHelper(pdf2).getAllPages();
    size_t npages = (pages1.size() < pages2.size() ? pages1.size() : pages2.size());
    for (size_t i = 0; i < npages; ++i) {
        QPDFPageObjectHelper& ph1 = pages1.at(i);
        QPDFPageObjectHelper& ph2 = pages2.at(i);
        QPDFObjectHandle fo = pdf.copyForeignObject(ph2.getFormXObjectForPage());
        int min_suffix = 1;
        QPDFObjectHandle resources = ph1.getAttribute("/Resources", true);
        std::string name = resources.getUniqueResourceName("/Fx", min_suffix);
        std::string content = ph1.placeFormXObject(
            fo, name, ph1.getTrimBox().getArrayAsRectangle(), false, allow_shrink, allow_expand);
        if (!content.empty()) {
            resources.mergeResources(QPDFObjectHandle::parse("<< /XObject << >> >>"));
            resources.getKey("/XObject").replaceKey(name, fo);
            ph1.addPageContents(QPDFObjectHandle::newStream(&pdf, "q\n"), true);
            ph1.addPageContents(QPDFObjectHandle::newStream(&pdf, "\nQ\n" + content), false);
        }
    }
    QPDFWriter w(pdf, "a.pdf");
    w.setQDFMode(true);
    w.setStaticID(true);
    w.write();
}